

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolBuilders.cpp
# Opt level: O1

FormalArgumentSymbol * __thiscall
slang::ast::MethodBuilder::copyArg(MethodBuilder *this,FormalArgumentSymbol *fromArg)

{
  ExpressionSyntax *pEVar1;
  SourceLocation SVar2;
  FormalArgumentSymbol *pFVar3;
  FormalArgumentSymbol *arg;
  FormalArgumentSymbol *local_20;
  
  local_20 = BumpAllocator::
             emplace<slang::ast::FormalArgumentSymbol,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,slang::ast::ArgumentDirection_const&,slang::ast::VariableLifetime_const&>
                       (&this->compilation->super_BumpAllocator,
                        &(fromArg->super_VariableSymbol).super_ValueSymbol.super_Symbol.name,
                        &(fromArg->super_VariableSymbol).super_ValueSymbol.super_Symbol.location,
                        &fromArg->direction,&(fromArg->super_VariableSymbol).lifetime);
  (local_20->super_VariableSymbol).flags.m_bits = (fromArg->super_VariableSymbol).flags.m_bits;
  Scope::addMember(&this->symbol->super_Scope,(Symbol *)local_20);
  SmallVectorBase<slang::ast::FormalArgumentSymbol_const*>::
  emplace_back<slang::ast::FormalArgumentSymbol_const*const&>
            ((SmallVectorBase<slang::ast::FormalArgumentSymbol_const*> *)&this->args,&local_20);
  pFVar3 = local_20;
  DeclaredType::setLink
            (&(local_20->super_VariableSymbol).super_ValueSymbol.declaredType,
             &(fromArg->super_VariableSymbol).super_ValueSymbol.declaredType);
  pEVar1 = (fromArg->super_VariableSymbol).super_ValueSymbol.declaredType.initializerSyntax;
  if (pEVar1 != (ExpressionSyntax *)0x0) {
    if ((pFVar3->super_VariableSymbol).super_ValueSymbol.declaredType.initializer !=
        (Expression *)0x0) {
      assert::assertFailed
                ("!initializer",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/types/DeclaredType.h"
                 ,0x9e,
                 "void slang::ast::DeclaredType::setInitializerSyntax(const syntax::ExpressionSyntax &, SourceLocation)"
                );
    }
    SVar2 = (fromArg->super_VariableSymbol).super_ValueSymbol.declaredType.initializerLocation;
    (pFVar3->super_VariableSymbol).super_ValueSymbol.declaredType.initializerSyntax = pEVar1;
    (pFVar3->super_VariableSymbol).super_ValueSymbol.declaredType.initializerLocation = SVar2;
  }
  return local_20;
}

Assistant:

FormalArgumentSymbol& MethodBuilder::copyArg(const FormalArgumentSymbol& fromArg) {
    auto arg = compilation.emplace<FormalArgumentSymbol>(fromArg.name, fromArg.location,
                                                         fromArg.direction, fromArg.lifetime);
    arg->flags = fromArg.flags;
    symbol.addMember(*arg);
    args.push_back(arg);

    auto& argDT = *arg->getDeclaredType();
    auto& fromDT = *fromArg.getDeclaredType();
    argDT.setLink(fromDT);

    if (auto expr = fromDT.getInitializerSyntax())
        argDT.setInitializerSyntax(*expr, fromDT.getInitializerLocation());

    return *arg;
}